

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
::select_variables(solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                   *this,int r_size,int bkmin,int bkmax)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  rc_data *prVar4;
  int iVar5;
  ulong uVar6;
  
  prVar4 = (this->R)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
           ._M_head_impl;
  uVar3 = 0xfffffffffffffffe;
  iVar5 = 0;
  uVar6 = 0xffffffffffffffff;
  while( true ) {
    if ((long)r_size <= (long)uVar6) {
      return (int)uVar3;
    }
    uVar1 = uVar6;
    if (bkmax < iVar5) {
      uVar1 = uVar3;
    }
    uVar2 = uVar3;
    if (bkmin <= iVar5) {
      uVar2 = uVar1;
    }
    uVar3 = uVar2 & 0xffffffff;
    if (((int)uVar2 != -2) && (prVar4->value < (longdouble)0)) break;
    iVar5 = iVar5 + prVar4->f;
    uVar6 = uVar6 + 1;
    prVar4 = prVar4 + 1;
  }
  return (int)uVar2;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        int sum = 0;
        int best = -2;

        for (int i = -1; i < r_size; ++i) {
            if (bkmin <= sum && sum <= bkmax)
                best = i;

            if (best != -2 && i - 1 < r_size &&
                stop_iterating<Mode>(R[i + 1].value))
                break;

            sum += R[i + 1].f;
        }

        return best;
    }